

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

ssize_t MaxQueuedMetadata(SstStream Stream)

{
  SstStream in_RDI;
  ssize_t MaxTimestep;
  _TimestepMetadataList *Next;
  long local_20;
  _TimestepMetadataList *local_18;
  ssize_t local_8;
  
  local_20 = -1;
  local_18 = in_RDI->Timesteps;
  if (local_18 == (_TimestepMetadataList *)0x0) {
    CP_verbose(in_RDI,TraceVerbose,"MaxQueued Timestep returning -1\n");
    local_8 = -1;
  }
  else {
    for (; local_18 != (_TimestepMetadataList *)0x0; local_18 = local_18->Next) {
      if (local_20 <= local_18->MetadataMsg->Timestep) {
        local_20 = local_18->MetadataMsg->Timestep;
      }
    }
    CP_verbose(in_RDI,TraceVerbose,"MaxQueued Timestep returning %zd\n",local_20);
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static ssize_t MaxQueuedMetadata(SstStream Stream)
{
    struct _TimestepMetadataList *Next;
    ssize_t MaxTimestep = -1;
    STREAM_ASSERT_LOCKED(Stream);
    Next = Stream->Timesteps;
    if (Next == NULL)
    {
        CP_verbose(Stream, TraceVerbose, "MaxQueued Timestep returning -1\n");
        return -1;
    }
    while (Next)
    {
        if (Next->MetadataMsg->Timestep >= MaxTimestep)
        {
            MaxTimestep = Next->MetadataMsg->Timestep;
        }
        Next = Next->Next;
    }
    CP_verbose(Stream, TraceVerbose, "MaxQueued Timestep returning %zd\n", MaxTimestep);
    return MaxTimestep;
}